

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O2

void __thiscall
duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>
          (duckdb *this,Vector *constant,Vector *other,Vector *result,DataChunk *args)

{
  Vector VVar1;
  UnifiedVectorFormat *count;
  double *pdVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  idx_t iVar4;
  pointer pcVar5;
  CachedJaroSimilarity<char> *pCVar6;
  string *psVar7;
  reference pvVar8;
  UnifiedVectorFormat *pUVar9;
  UnifiedVectorFormat *pUVar10;
  ValidityMask *pVVar11;
  ValidityMask *pVVar12;
  idx_t i_2;
  TemplatedValidityMask<unsigned_long> *other_00;
  undefined8 *puVar14;
  long lVar15;
  ulong uVar16;
  VectorType VVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  idx_t i;
  UnifiedVectorFormat *pUVar21;
  Vector *pVVar22;
  double dVar23;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  value_type score_cutoff;
  undefined7 uStack_1df;
  long local_1d8;
  long local_1d0;
  ValidityMask *local_1c0;
  ValidityMask local_1b8 [2];
  UnifiedVectorFormat ldata;
  long local_170;
  long local_168;
  CachedJaroSimilarity<char> cached;
  string str_val;
  long *local_b8;
  long local_b0;
  long local_a8;
  Value val;
  char local_58;
  undefined7 uVar13;
  
  pVVar22 = result;
  duckdb::Vector::GetValue((ulong)&val);
  count = *(UnifiedVectorFormat **)(result + 0x18);
  if (local_58 == '\x01') {
    FlatVector::VerifyFlatVector(other);
    TemplatedValidityMask<unsigned_long>::SetAllInvalid
              ((TemplatedValidityMask<unsigned_long> *)(other + 0x28),(idx_t)count);
    goto LAB_007ad5bc;
  }
  psVar7 = (string *)duckdb::StringValue::Get_abi_cxx11_(&val);
  std::__cxx11::string::string((string *)&str_val,psVar7);
  duckdb_jaro_winkler::CachedJaroSimilarity<char>::CachedJaroSimilarity<std::__cxx11::string>
            (&cached,&str_val);
  VVar17 = (VectorType)other;
  if (*(long *)(result + 8) - *(long *)result == 0xd0) {
    _ldata = &cached;
    if (*constant == (Vector)0x0) {
      duckdb::Vector::SetVectorType(VVar17);
      lVar15 = *(long *)(other + 0x20);
      lVar18 = *(long *)(constant + 0x20);
      FlatVector::VerifyFlatVector(constant);
      FlatVector::VerifyFlatVector(other);
      other_00 = (TemplatedValidityMask<unsigned_long> *)(constant + 0x28);
      if (other_00->validity_mask == (unsigned_long *)0x0) {
        puVar14 = (undefined8 *)(lVar18 + 8);
        for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
          input_02.value.pointer.ptr = (char *)*puVar14;
          input_02.value._0_8_ = puVar14[-1];
          dVar23 = UnaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                             (input_02,(ValidityMask *)&ldata,(idx_t)pVVar22,args);
          *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
          puVar14 = puVar14 + 2;
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::Initialize
                  ((TemplatedValidityMask<unsigned_long> *)(other + 0x28),other_00);
        lVar18 = lVar18 + 8;
        pUVar21 = (UnifiedVectorFormat *)0x0;
        for (uVar20 = 0; uVar20 != (ulong)(count + 0x3f) >> 6; uVar20 = uVar20 + 1) {
          if (other_00->validity_mask == (unsigned_long *)0x0) {
            pUVar9 = pUVar21 + 0x40;
            if (count <= pUVar21 + 0x40) {
              pUVar9 = count;
            }
LAB_007ad24a:
            puVar14 = (undefined8 *)((long)pUVar21 * 0x10 + lVar18);
            for (; pUVar10 = pUVar21, pUVar21 < pUVar9; pUVar21 = pUVar21 + 1) {
              input.value.pointer.ptr = (char *)*puVar14;
              input.value._0_8_ = puVar14[-1];
              dVar23 = UnaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                                 (input,(ValidityMask *)&ldata,(idx_t)pVVar22,args);
              *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
              puVar14 = puVar14 + 2;
            }
          }
          else {
            uVar16 = other_00->validity_mask[uVar20];
            pUVar9 = pUVar21 + 0x40;
            if (count <= pUVar21 + 0x40) {
              pUVar9 = count;
            }
            if (uVar16 == 0xffffffffffffffff) goto LAB_007ad24a;
            pUVar10 = pUVar9;
            if (uVar16 != 0) {
              puVar14 = (undefined8 *)((long)pUVar21 * 0x10 + lVar18);
              for (uVar19 = 0; pUVar10 = pUVar21 + uVar19, pUVar21 + uVar19 < pUVar9;
                  uVar19 = uVar19 + 1) {
                if ((uVar16 >> (uVar19 & 0x3f) & 1) != 0) {
                  input_00.value.pointer.ptr = (char *)*puVar14;
                  input_00.value._0_8_ = puVar14[-1];
                  dVar23 = UnaryLambdaWrapper::
                           Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                                     (input_00,(ValidityMask *)&ldata,(idx_t)pVVar22,args);
                  *(double *)(lVar15 + (long)pUVar21 * 8 + uVar19 * 8) = dVar23;
                }
                puVar14 = puVar14 + 2;
              }
            }
          }
          pUVar21 = pUVar10;
        }
      }
    }
    else if (*constant == (Vector)0x2) {
      duckdb::Vector::SetVectorType(VVar17);
      pdVar2 = *(double **)(other + 0x20);
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(constant + 0x20);
      if ((*(byte **)(constant + 0x28) == (byte *)0x0) || ((**(byte **)(constant + 0x28) & 1) != 0))
      {
        duckdb::ConstantVector::SetNull(other,false);
        dVar23 = UnaryLambdaWrapper::
                 Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                           ((string_t)paVar3->pointer,(ValidityMask *)&ldata,(idx_t)pVVar22,args);
        *pdVar2 = dVar23;
      }
      else {
        duckdb::ConstantVector::SetNull(other,true);
      }
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&score_cutoff);
      duckdb::Vector::ToUnifiedFormat((ulong)constant,count);
      duckdb::Vector::SetVectorType(VVar17);
      lVar15 = *(long *)(other + 0x20);
      FlatVector::VerifyFlatVector(other);
      if (local_1d0 == 0) {
        for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
          iVar4 = *(idx_t *)CONCAT71(uStack_1df,score_cutoff);
          pUVar9 = pUVar21;
          if (iVar4 != 0) {
            pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(iVar4 + (long)pUVar21 * 4);
          }
          input_03.value.pointer.ptr = (char *)*(undefined8 *)(local_1d8 + 8 + (long)pUVar9 * 0x10);
          input_03.value._0_8_ = *(undefined8 *)(local_1d8 + (long)pUVar9 * 0x10);
          dVar23 = UnaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                             (input_03,(ValidityMask *)&ldata,iVar4,args);
          *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
        }
      }
      else {
        for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
          iVar4 = *(idx_t *)CONCAT71(uStack_1df,score_cutoff);
          pUVar9 = pUVar21;
          if (iVar4 != 0) {
            pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(iVar4 + (long)pUVar21 * 4);
          }
          uVar20 = *(ulong *)(local_1d0 + ((ulong)pUVar9 >> 6) * 8);
          if ((uVar20 >> ((ulong)pUVar9 & 0x3f) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      ((TemplatedValidityMask<unsigned_long> *)(other + 0x28),(idx_t)pUVar21);
          }
          else {
            input_01.value.pointer.ptr =
                 (char *)*(undefined8 *)(local_1d8 + 8 + (long)pUVar9 * 0x10);
            input_01.value._0_8_ = *(undefined8 *)(local_1d8 + (long)pUVar9 * 0x10);
            dVar23 = UnaryLambdaWrapper::
                     Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&)_1_,duckdb::string_t,double>
                               (input_01,(ValidityMask *)&ldata,uVar20,args);
            *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&score_cutoff);
    }
  }
  else {
    pvVar8 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)result,2);
    duckdb::Vector::Vector(&score_cutoff,pvVar8);
    VVar1 = *constant;
    uVar13 = (undefined7)((ulong)pVVar22 >> 8);
    pVVar11 = (ValidityMask *)CONCAT71(uVar13,score_cutoff);
    if (((byte)VVar1 ^ 2) == 0 && ((byte)score_cutoff ^ 2) == 0) {
      duckdb::Vector::SetVectorType(VVar17);
      pdVar2 = *(double **)(other + 0x20);
      if (((*(byte **)(constant + 0x28) == (byte *)0x0) || ((**(byte **)(constant + 0x28) & 1) != 0)
          ) && ((local_1b8[0].super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((*local_1b8[0].super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0))
               )) {
        dVar23 = BinaryLambdaWrapper::
                 Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                           (&cached,(string_t)
                                    (*(anon_union_16_2_67f50693_for_value **)(constant + 0x20))->
                                    pointer,
                            (double)(local_1c0->super_TemplatedValidityMask<unsigned_long>).
                                    validity_mask,local_1c0,(idx_t)args);
        *pdVar2 = dVar23;
      }
      else {
LAB_007ad3db:
        duckdb::ConstantVector::SetNull(other,true);
      }
    }
    else if (((byte)score_cutoff ^ 2) == 0 && VVar1 == (Vector)0x0) {
      lVar15 = *(long *)(constant + 0x20);
      if ((local_1b8[0].super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((*local_1b8[0].super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) == 0)) {
LAB_007ad3d0:
        duckdb::Vector::SetVectorType(VVar17);
        goto LAB_007ad3db;
      }
      duckdb::Vector::SetVectorType(VVar17);
      lVar18 = *(long *)(other + 0x20);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(constant);
      FlatVector::SetValidity(other,(ValidityMask *)(constant + 0x28));
      if (*(long *)(other + 0x28) == 0) {
        puVar14 = (undefined8 *)(lVar15 + 8);
        for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
          left_02.value.pointer.ptr = (char *)*puVar14;
          left_02.value._0_8_ = puVar14[-1];
          dVar23 = BinaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                             (&cached,left_02,
                              (double)(local_1c0->super_TemplatedValidityMask<unsigned_long>).
                                      validity_mask,pVVar11,(idx_t)args);
          *(double *)(lVar18 + (long)pUVar21 * 8) = dVar23;
          puVar14 = puVar14 + 2;
        }
      }
      else {
        lVar15 = lVar15 + 8;
        pUVar21 = (UnifiedVectorFormat *)0x0;
        for (pVVar11 = (ValidityMask *)0x0; pVVar11 != (ValidityMask *)((ulong)(count + 0x3f) >> 6);
            pVVar11 = (ValidityMask *)
                      ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1)) {
          if (*(long *)(other + 0x28) == 0) {
            pUVar9 = pUVar21 + 0x40;
            if (count <= pUVar21 + 0x40) {
              pUVar9 = count;
            }
LAB_007ad0de:
            puVar14 = (undefined8 *)((long)pUVar21 * 0x10 + lVar15);
            pVVar12 = pVVar11;
            for (; pUVar10 = pUVar21, pUVar21 < pUVar9; pUVar21 = pUVar21 + 1) {
              left.value.pointer.ptr = (char *)*puVar14;
              left.value._0_8_ = puVar14[-1];
              dVar23 = BinaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                 (&cached,left,
                                  (double)(local_1c0->super_TemplatedValidityMask<unsigned_long>).
                                          validity_mask,pVVar12,(idx_t)args);
              *(double *)(lVar18 + (long)pUVar21 * 8) = dVar23;
              puVar14 = puVar14 + 2;
            }
          }
          else {
            uVar20 = *(ulong *)(*(long *)(other + 0x28) + (long)pVVar11 * 8);
            pUVar9 = pUVar21 + 0x40;
            if (count <= pUVar21 + 0x40) {
              pUVar9 = count;
            }
            if (uVar20 == 0xffffffffffffffff) goto LAB_007ad0de;
            pUVar10 = pUVar9;
            if (uVar20 != 0) {
              puVar14 = (undefined8 *)((long)pUVar21 * 0x10 + lVar15);
              pVVar12 = pVVar11;
              for (uVar16 = 0; pUVar10 = pUVar21 + uVar16, pUVar21 + uVar16 < pUVar9;
                  uVar16 = uVar16 + 1) {
                if ((uVar20 >> (uVar16 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*puVar14;
                  left_00.value._0_8_ = puVar14[-1];
                  dVar23 = BinaryLambdaWrapper::
                           Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                     (&cached,left_00,
                                      (double)(local_1c0->super_TemplatedValidityMask<unsigned_long>
                                              ).validity_mask,pVVar12,(idx_t)args);
                  *(double *)(lVar18 + (long)pUVar21 * 8 + uVar16 * 8) = dVar23;
                }
                puVar14 = puVar14 + 2;
              }
            }
          }
          pUVar21 = pUVar10;
        }
      }
    }
    else if (((byte)VVar1 ^ 2) == 0 && score_cutoff == (value_type)0x0) {
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(constant + 0x20);
      if ((*(byte **)(constant + 0x28) != (byte *)0x0) && ((**(byte **)(constant + 0x28) & 1) == 0))
      goto LAB_007ad3d0;
      duckdb::Vector::SetVectorType(VVar17);
      lVar15 = *(long *)(other + 0x20);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(&score_cutoff);
      FlatVector::SetValidity(other,local_1b8);
      if (*(long *)(other + 0x28) == 0) {
        for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
          dVar23 = BinaryLambdaWrapper::
                   Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                             (&cached,(string_t)paVar3->pointer,
                              (double)(&(local_1c0->super_TemplatedValidityMask<unsigned_long>).
                                        validity_mask)[(long)pUVar21],pVVar11,(idx_t)args);
          *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
        }
      }
      else {
        pUVar21 = (UnifiedVectorFormat *)0x0;
        for (pVVar11 = (ValidityMask *)0x0; pVVar11 != (ValidityMask *)((ulong)(count + 0x3f) >> 6);
            pVVar11 = (ValidityMask *)
                      ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1)) {
          pVVar12 = pVVar11;
          if (*(long *)(other + 0x28) == 0) {
            pUVar9 = pUVar21 + 0x40;
            if (count <= pUVar21 + 0x40) {
              pUVar9 = count;
            }
LAB_007ad6b2:
            for (; pUVar10 = pUVar21, pUVar21 < pUVar9; pUVar21 = pUVar21 + 1) {
              dVar23 = BinaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                 (&cached,(string_t)paVar3->pointer,
                                  (double)(&(local_1c0->super_TemplatedValidityMask<unsigned_long>).
                                            validity_mask)[(long)pUVar21],pVVar12,(idx_t)args);
              *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
            }
          }
          else {
            uVar20 = *(ulong *)(*(long *)(other + 0x28) + (long)pVVar11 * 8);
            pUVar9 = pUVar21 + 0x40;
            if (count <= pUVar21 + 0x40) {
              pUVar9 = count;
            }
            if (uVar20 == 0xffffffffffffffff) goto LAB_007ad6b2;
            pUVar10 = pUVar9;
            if (uVar20 != 0) {
              for (uVar16 = 0; pUVar10 = pUVar21 + uVar16, pUVar21 + uVar16 < pUVar9;
                  uVar16 = uVar16 + 1) {
                if ((uVar20 >> (uVar16 & 0x3f) & 1) != 0) {
                  dVar23 = BinaryLambdaWrapper::
                           Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                     (&cached,(string_t)paVar3->pointer,
                                      (double)(&(local_1c0->
                                                super_TemplatedValidityMask<unsigned_long>).
                                                validity_mask)[(long)(pUVar21 + uVar16)],pVVar12,
                                      (idx_t)args);
                  *(double *)((long)pUVar21 * 8 + lVar15 + uVar16 * 8) = dVar23;
                }
              }
            }
          }
          pUVar21 = pUVar10;
        }
      }
    }
    else {
      pVVar11 = (ValidityMask *)CONCAT71(uVar13,(byte)score_cutoff | (byte)VVar1);
      if (((byte)score_cutoff | (byte)VVar1) == 0) {
        lVar15 = *(long *)(constant + 0x20);
        duckdb::Vector::SetVectorType(VVar17);
        lVar18 = *(long *)(other + 0x20);
        FlatVector::VerifyFlatVector(other);
        FlatVector::VerifyFlatVector(constant);
        FlatVector::SetValidity(other,(ValidityMask *)(constant + 0x28));
        FlatVector::VerifyFlatVector(&score_cutoff);
        pVVar22 = other + 0x28;
        duckdb::ValidityMask::Combine((ValidityMask *)pVVar22,(ulong)local_1b8);
        if (*(long *)pVVar22 == 0) {
          puVar14 = (undefined8 *)(lVar15 + 8);
          for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
            left_06.value.pointer.ptr = (char *)*puVar14;
            left_06.value._0_8_ = puVar14[-1];
            dVar23 = BinaryLambdaWrapper::
                     Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                               (&cached,left_06,
                                (double)(&(local_1c0->super_TemplatedValidityMask<unsigned_long>).
                                          validity_mask)[(long)pUVar21],pVVar11,(idx_t)args);
            *(double *)(lVar18 + (long)pUVar21 * 8) = dVar23;
            puVar14 = puVar14 + 2;
          }
        }
        else {
          lVar15 = lVar15 + 8;
          pUVar21 = (UnifiedVectorFormat *)0x0;
          for (pVVar11 = (ValidityMask *)0x0;
              pVVar11 != (ValidityMask *)((ulong)(count + 0x3f) >> 6);
              pVVar11 = (ValidityMask *)
                        ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + 1)) {
            if (*(long *)pVVar22 == 0) {
              pUVar9 = pUVar21 + 0x40;
              if (count <= pUVar21 + 0x40) {
                pUVar9 = count;
              }
LAB_007ad85a:
              puVar14 = (undefined8 *)((long)pUVar21 * 0x10 + lVar15);
              pVVar12 = pVVar11;
              for (; pUVar10 = pUVar21, pUVar21 < pUVar9; pUVar21 = pUVar21 + 1) {
                left_03.value.pointer.ptr = (char *)*puVar14;
                left_03.value._0_8_ = puVar14[-1];
                dVar23 = BinaryLambdaWrapper::
                         Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                   (&cached,left_03,
                                    (double)(&(local_1c0->super_TemplatedValidityMask<unsigned_long>
                                              ).validity_mask)[(long)pUVar21],pVVar12,(idx_t)args);
                *(double *)(lVar18 + (long)pUVar21 * 8) = dVar23;
                puVar14 = puVar14 + 2;
              }
            }
            else {
              uVar20 = *(ulong *)(*(long *)pVVar22 + (long)pVVar11 * 8);
              pUVar9 = pUVar21 + 0x40;
              if (count <= pUVar21 + 0x40) {
                pUVar9 = count;
              }
              if (uVar20 == 0xffffffffffffffff) goto LAB_007ad85a;
              pUVar10 = pUVar9;
              if (uVar20 != 0) {
                puVar14 = (undefined8 *)((long)pUVar21 * 0x10 + lVar15);
                pVVar12 = pVVar11;
                for (uVar16 = 0; pUVar10 = pUVar21 + uVar16, pUVar21 + uVar16 < pUVar9;
                    uVar16 = uVar16 + 1) {
                  if ((uVar20 >> (uVar16 & 0x3f) & 1) != 0) {
                    left_04.value.pointer.ptr = (char *)*puVar14;
                    left_04.value._0_8_ = puVar14[-1];
                    dVar23 = BinaryLambdaWrapper::
                             Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                       (&cached,left_04,
                                        (double)(&(local_1c0->
                                                  super_TemplatedValidityMask<unsigned_long>).
                                                  validity_mask)[(long)(pUVar21 + uVar16)],pVVar12,
                                        (idx_t)args);
                    *(double *)((long)pUVar21 * 8 + lVar18 + uVar16 * 8) = dVar23;
                  }
                  puVar14 = puVar14 + 2;
                }
              }
            }
            pUVar21 = pUVar10;
          }
        }
      }
      else {
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
        duckdb::Vector::ToUnifiedFormat((ulong)constant,count);
        duckdb::Vector::ToUnifiedFormat((ulong)&score_cutoff,count);
        duckdb::Vector::SetVectorType(VVar17);
        pCVar6 = _ldata;
        lVar15 = *(long *)(other + 0x20);
        FlatVector::VerifyFlatVector(other);
        if (local_a8 == 0 && local_168 == 0) {
          for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
            pcVar5 = (pCVar6->s1)._M_dataplus._M_p;
            pUVar9 = pUVar21;
            if (pcVar5 != (pointer)0x0) {
              pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(pcVar5 + (long)pUVar21 * 4);
            }
            pUVar10 = pUVar21;
            if (*local_b8 != 0) {
              pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_b8 + (long)pUVar21 * 4);
            }
            left_01.value.pointer.ptr = (char *)*(undefined8 *)(local_170 + 8 + (long)pUVar9 * 0x10)
            ;
            left_01.value._0_8_ = *(undefined8 *)(local_170 + (long)pUVar9 * 0x10);
            dVar23 = BinaryLambdaWrapper::
                     Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                               (&cached,left_01,*(double *)(local_b0 + (long)pUVar10 * 8),
                                (ValidityMask *)pUVar10,(idx_t)args);
            *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
          }
        }
        else {
          for (pUVar21 = (UnifiedVectorFormat *)0x0; count != pUVar21; pUVar21 = pUVar21 + 1) {
            pcVar5 = (pCVar6->s1)._M_dataplus._M_p;
            pUVar9 = pUVar21;
            if (pcVar5 != (pointer)0x0) {
              pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(pcVar5 + (long)pUVar21 * 4);
            }
            pUVar10 = pUVar21;
            if (*local_b8 != 0) {
              pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_b8 + (long)pUVar21 * 4);
            }
            if (((local_168 == 0) ||
                ((*(ulong *)(local_168 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1) !=
                 0)) && ((local_a8 == 0 ||
                         ((*(ulong *)(local_a8 + ((ulong)pUVar10 >> 6) * 8) >>
                           ((ulong)pUVar10 & 0x3f) & 1) != 0)))) {
              left_05.value.pointer.ptr =
                   (char *)*(undefined8 *)(local_170 + 8 + (long)pUVar9 * 0x10);
              left_05.value._0_8_ = *(undefined8 *)(local_170 + (long)pUVar9 * 0x10);
              dVar23 = BinaryLambdaWrapper::
                       Operation<duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::DataChunk&)::_lambda(duckdb::string_t_const&,double)_1_,bool,duckdb::string_t,double,double>
                                 (&cached,left_05,*(double *)(local_b0 + (long)pUVar10 * 8),
                                  (ValidityMask *)pUVar10,(idx_t)args);
              *(double *)(lVar15 + (long)pUVar21 * 8) = dVar23;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        ((TemplatedValidityMask<unsigned_long> *)(other + 0x28),(idx_t)pUVar21);
            }
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
        UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
      }
    }
    Vector::~Vector(&score_cutoff);
  }
  duckdb_jaro_winkler::CachedJaroSimilarity<char>::~CachedJaroSimilarity(&cached);
  std::__cxx11::string::~string((string *)&str_val);
LAB_007ad5bc:
  duckdb::Value::~Value(&val);
  return;
}

Assistant:

static void CachedFunction(Vector &constant, Vector &other, Vector &result, DataChunk &args) {
	auto val = constant.GetValue(0);
	idx_t count = args.size();
	if (val.IsNull()) {
		auto &result_validity = FlatVector::Validity(result);
		result_validity.SetAllInvalid(count);
		return;
	}

	auto str_val = StringValue::Get(val);
	auto cached = CACHED_SIMILARITY(str_val);

	D_ASSERT(args.ColumnCount() == 2 || args.ColumnCount() == 3);
	if (args.ColumnCount() == 2) {
		UnaryExecutor::Execute<string_t, double>(other, result, count, [&](const string_t &other_str) {
			auto other_str_begin = other_str.GetData();
			return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize());
		});
	} else {
		auto score_cutoff = args.data[2];
		BinaryExecutor::Execute<string_t, double_t, double>(
		    other, score_cutoff, result, count, [&](const string_t &other_str, const double_t score_cutoff) {
			    auto other_str_begin = other_str.GetData();
			    return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize(), score_cutoff);
		    });
	}
}